

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_graph.cpp
# Opt level: O0

void Omega_h::map_into<long>(Read<long> *a_data,Graph *a2b,Write<long> *b_data,Int width)

{
  Write<long> local_98;
  Read<int> local_88;
  Read<long> local_78 [2];
  Read<int> local_58;
  Read<long> local_48;
  undefined1 local_38 [8];
  Read<long> ab_data;
  Int width_local;
  Write<long> *b_data_local;
  Graph *a2b_local;
  Read<long> *a_data_local;
  
  ab_data.write_.shared_alloc_.direct_ptr._4_4_ = width;
  Read<long>::Read(&local_48,(Read<int> *)a_data);
  Read<int>::Read(&local_58,&a2b->a2ab);
  expand<long>((Omega_h *)local_38,(Read<signed_char> *)&local_48,&local_58,
               ab_data.write_.shared_alloc_.direct_ptr._4_4_);
  Read<int>::~Read(&local_58);
  Read<long>::~Read(&local_48);
  Read<long>::Read(local_78,(Read<int> *)local_38);
  Read<int>::Read(&local_88,&a2b->ab2b);
  Write<long>::Write(&local_98,(Write<int> *)b_data);
  map_into<long>((Read<signed_char> *)local_78,&local_88,(Write<signed_char> *)&local_98,
                 ab_data.write_.shared_alloc_.direct_ptr._4_4_);
  Write<long>::~Write(&local_98);
  Read<int>::~Read(&local_88);
  Read<long>::~Read(local_78);
  Read<long>::~Read((Read<long> *)local_38);
  return;
}

Assistant:

void map_into(Read<T> a_data, Graph a2b, Write<T> b_data, Int width) {
  auto ab_data = expand(a_data, a2b.a2ab, width);
  map_into(ab_data, a2b.ab2b, b_data, width);
}